

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ext_loader_impl.cpp
# Opt level: O2

loader_impl_data ext_loader_impl_initialize(loader_impl impl,configuration config)

{
  int iVar1;
  loader_impl_ext_type *this;
  
  this = (loader_impl_ext_type *)operator_new(0x60);
  *(undefined8 *)&(this->paths)._M_t._M_impl = 0;
  *(undefined8 *)&(this->paths)._M_t._M_impl.super__Rb_tree_header._M_header = 0;
  (this->paths)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->paths)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)0x0;
  (this->paths)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
  (this->paths)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  *(undefined8 *)&(this->destroy_list)._M_t._M_impl = 0;
  *(undefined8 *)&(this->destroy_list)._M_t._M_impl.super__Rb_tree_header._M_header = 0;
  (this->destroy_list)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->destroy_list)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)0x0;
  (this->destroy_list)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
  (this->destroy_list)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  loader_impl_ext_type::loader_impl_ext_type(this);
  iVar1 = ext_loader_impl_initialize_types(impl);
  if (iVar1 == 0) {
    loader_initialization_register(impl);
  }
  else {
    loader_impl_ext_type::~loader_impl_ext_type(this);
    operator_delete(this,0x60);
    this = (loader_impl_ext_type *)0x0;
  }
  return this;
}

Assistant:

loader_impl_data ext_loader_impl_initialize(loader_impl impl, configuration config)
{
	loader_impl_ext ext_impl = new loader_impl_ext_type();

	(void)impl;
	(void)config;

	if (ext_impl == nullptr)
	{
		return NULL;
	}

	if (ext_loader_impl_initialize_types(impl) != 0)
	{
		delete ext_impl;

		return NULL;
	}

	/* Register initialization */
	loader_initialization_register(impl);

	return static_cast<loader_impl_data>(ext_impl);
}